

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

char * __thiscall format_iter::next(format_iter *this,size_t *len)

{
  CVmNativeCodeDesc *pCVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  char *str;
  vm_val_t ele;
  char *local_30;
  int local_28;
  vm_val_t *in_stack_ffffffffffffffe0;
  vm_val_t *this_00;
  
  *(size_t *)in_RSI = 0;
  this_00 = in_RDI;
  while( true ) {
    while (in_RDI->typ != 0) {
      if (in_RDI[1].val.ptr < *(void **)(in_RDI + 1)) {
        sVar4 = strlen(*(char **)((long)(in_RDI->val).ptr + (long)in_RDI[1].val.ptr * 8));
        *(size_t *)in_RSI = sVar4;
        pCVar1 = in_RDI[1].val.native_desc;
        in_RDI[1].val.ptr = (void *)((long)&pCVar1->min_argc_ + 1);
        return *(char **)((long)(in_RDI->val).ptr + (long)pCVar1 * 8);
      }
      in_RDI->typ = 0;
    }
    if (in_RDI[2].val.ptr <= *(void **)(in_RDI + 3)) {
      return (char *)0x0;
    }
    iVar2 = vm_val_t::is_listlike(in_stack_ffffffffffffffe0);
    if (iVar2 == 0) break;
    *(long *)(in_RDI + 3) = *(long *)(in_RDI + 3) + 1;
    vm_val_t::ll_index(this_00,in_RSI,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    if (local_28 != 1) break;
    in_RDI->typ = VM_NIL;
  }
  local_30 = vm_val_t::get_as_string(in_RDI);
  if (local_30 != (char *)0x0) {
    sVar3 = vmb_get_len((char *)0x2f4e7d);
    *(size_t *)in_RSI = sVar3;
    local_30 = local_30 + 2;
  }
  return local_30;
}

Assistant:

const char *next(VMG_ size_t &len)
    {
        /* assume we won't find anythign */
        len = 0;

        /* keep going until we find something */
        for (;;)
        {
            if (mode == 0)
            {
                /* custom list - if exhausted, we're done */
                if (cidx >= custom_cnt)
                    return 0;

                /* get the next custom item, according to the source type */
                vm_val_t ele;
                if (custom->is_listlike(vmg0_))
                {
                    /* get the next list element */
                    custom->ll_index(vmg_ &ele, ++cidx);

                    /* if it's nil, switch to the builtin list */
                    if (ele.typ == VM_NIL)
                    {
                        mode = 1;
                        continue;
                    }
                }
                else
                {
                    /* it must be a single string */
                    ele = *custom;
                }

                /* retrieve the string value */
                const char *str = ele.get_as_string(vmg0_);
                if (str != 0)
                {
                    len = vmb_get_len(str);
                    str += VMB_LEN;
                }
                return str;
            }
            else
            {
                /* builtin list - if exhausted, return to the custom list */
                if (bidx >= builtin_cnt)
                {
                    mode = 0;
                    continue;
                }

                /* return the next builtin item */
                len = strlen(builtin[bidx]);
                return builtin[bidx++];
            }
        }
    }